

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void __thiscall CProficiencies::WriteProfs(CProficiencies *this,void *vfp)

{
  long lVar1;
  long lVar2;
  int i;
  long lVar3;
  
  fprintf((FILE *)vfp,"ProfPoints %d %ld\n",(ulong)(uint)this->points,this->pawardedtime);
  lVar1 = (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                _M_impl.super__Vector_impl_data._M_start;
  lVar2 = 2;
  for (lVar3 = 0; lVar1 / 0x28 != lVar3; lVar3 = lVar3 + 1) {
    if (-1 < this->profs[lVar3]) {
      fprintf((FILE *)vfp,"Prof %s~ %d\n",
              *(undefined8 *)
               ((long)&(prof_table.
                        super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                        _M_impl.super__Vector_impl_data._M_start)->ppsn + lVar2 * 4));
    }
    lVar2 = lVar2 + 10;
  }
  return;
}

Assistant:

void CProficiencies::WriteProfs(void *vfp)
{
	FILE *fp = static_cast<FILE *>(vfp);
	fprintf(fp,"ProfPoints %d %ld\n", points, pawardedtime);

	auto prof_table_size = std::size(prof_table);
	for (int i = 0; i < prof_table_size; i++)
	{
		if (profs[i] > -1)
			fprintf(fp, "Prof %s~ %d\n", prof_table[i].name, profs[i]);
	}
}